

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void flatbuffers::ForAllFields
               (Object *object,bool reverse,function<void_(const_reflection::Field_*)> *func)

{
  uint16_t uVar1;
  uint uVar2;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar3;
  return_type pFVar4;
  reference pvVar5;
  size_type_conflict sVar6;
  size_type_conflict local_b0;
  ulong local_58;
  size_t i_1;
  return_type field;
  uint32_t i;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> field_to_id_map;
  function<void_(const_reflection::Field_*)> *func_local;
  bool reverse_local;
  Object *object_local;
  
  field_to_id_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)func;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  pVVar3 = reflection::Object::fields(object);
  uVar2 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::size(pVVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)uVar2);
  field._0_4_ = 0;
  while( true ) {
    pVVar3 = reflection::Object::fields(object);
    uVar2 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::size(pVVar3);
    if (uVar2 <= (uint)field) break;
    pVVar3 = reflection::Object::fields(object);
    pFVar4 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get(pVVar3,(uint)field);
    uVar1 = reflection::Field::id(pFVar4);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)uVar1
                       );
    *pvVar5 = (uint)field;
    field._0_4_ = (uint)field + 1;
  }
  local_58 = 0;
  while( true ) {
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    if (sVar6 <= local_58) break;
    pVVar3 = reflection::Object::fields(object);
    if (reverse) {
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
      local_b0 = (sVar6 - local_58) + 1;
    }
    else {
      local_b0 = local_58;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,local_b0);
    pFVar4 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get(pVVar3,*pvVar5);
    std::function<void_(const_reflection::Field_*)>::operator()(func,pFVar4);
    local_58 = local_58 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return;
}

Assistant:

void ForAllFields(const reflection::Object *object, bool reverse,
                  std::function<void(const reflection::Field *)> func) {
  std::vector<uint32_t> field_to_id_map;
  field_to_id_map.resize(object->fields()->size());

  // Create the mapping of field ID to the index into the vector.
  for (uint32_t i = 0; i < object->fields()->size(); ++i) {
    auto field = object->fields()->Get(i);
    field_to_id_map[field->id()] = i;
  }

  for (size_t i = 0; i < field_to_id_map.size(); ++i) {
    func(object->fields()->Get(
        field_to_id_map[reverse ? field_to_id_map.size() - i + 1 : i]));
  }
}